

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void create_file(char *filename,curl_off_t size)

{
  FILE *__stream;
  FILE *file;
  curl_off_t size_local;
  char *filename_local;
  
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    fputs("create file error!",_stderr);
    exit(-1);
  }
  fseeko(__stream,size + -1,0);
  fwrite("",1,1,__stream);
  fclose(__stream);
  return;
}

Assistant:

void create_file(const char *filename, curl_off_t size) {
    FILE *file = fopen(filename, "wb");
    if (file == nullptr) {
        fputs("create file error!", stderr);
        exit(-1);
    }
    fseeko(file, size - 1, SEEK_SET);
    fwrite("\0", 1, 1, file);
    fclose(file);
}